

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall
TPZMatrix<float>::SolveDirect
          (TPZMatrix<float> *this,TPZFMatrix<float> *B,DecomposeType dt,
          list<long,_std::allocator<long>_> *singular)

{
  TPZFMatrix<float> *in_RCX;
  int in_EDX;
  TPZMatrix<float> *in_RSI;
  char *in_stack_000001c8;
  char *in_stack_000001d0;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 local_4;
  
  if (in_EDX == 1) {
    local_4 = Solve_LU((TPZMatrix<float> *)CONCAT44(1,in_stack_ffffffffffffffe0),in_RCX,
                       (list<long,_std::allocator<long>_> *)CONCAT44(1,in_stack_ffffffffffffffd0));
  }
  else if (in_EDX == 3) {
    local_4 = Solve_Cholesky((TPZMatrix<float> *)CONCAT44(3,in_stack_ffffffffffffffe0),in_RCX,
                             (list<long,_std::allocator<long>_> *)
                             CONCAT44(3,in_stack_ffffffffffffffd0));
  }
  else if (in_EDX == 4) {
    local_4 = Solve_LDLt(in_RSI,(TPZFMatrix<float> *)CONCAT44(4,in_stack_ffffffffffffffe0),
                         (list<long,_std::allocator<long>_> *)in_RCX);
  }
  else {
    Error(in_stack_000001d0,in_stack_000001c8);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int TPZMatrix<TVar>::SolveDirect( TPZFMatrix<TVar> &B , DecomposeType dt, std::list<int64_t> &singular) {
	
	switch ( dt ) {
		case ELU:
			return( Solve_LU( &B ,singular)  );
		case ECholesky:
			return( Solve_Cholesky( &B , singular)  );
		case ELDLt:
			return( Solve_LDLt( &B, singular )  );
		default:
			Error( "Solve  < Unknown decomposition type >" );
			break;
	}
	return ( 0 );
}